

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O0

int ndn_key_storage_set_self_identity(ndn_data_t *self_cert,ndn_ecc_prv_t *self_prv_key)

{
  int local_28;
  int local_24;
  int j;
  int i;
  ndn_ecc_prv_t *self_prv_key_local;
  ndn_data_t *self_cert_local;
  
  if (!_key_storage_initialized) {
    _ndn_key_storage_init();
  }
  local_24 = 0;
  while( true ) {
    if (2 < local_24) {
      return -10;
    }
    if (storage.self_identity_key[local_24].key_id == 0xffffffff) break;
    local_24 = local_24 + 1;
  }
  memcpy(storage.self_cert + local_24,self_cert,0x890);
  memcpy(storage.self_identity_key + local_24,self_prv_key,0x2c);
  for (local_28 = 0; local_28 < (int)((self_cert->name).components_size - 4);
      local_28 = local_28 + 1) {
    ndn_name_append_component
              (storage.self_identity + local_24,(self_cert->name).components + local_28);
  }
  ndn_name_print(storage.self_identity + local_24);
  return 0;
}

Assistant:

int
ndn_key_storage_set_self_identity(const ndn_data_t* self_cert, const ndn_ecc_prv_t* self_prv_key)
{
  if (!_key_storage_initialized)
    _ndn_key_storage_init();
  for (int i = 0; i < NDN_SEC_CERT_SIZE; i++) {
    if (storage.self_identity_key[i].key_id == NDN_SEC_INVALID_KEY_ID) {
      memcpy(&storage.self_cert[i], self_cert, sizeof(ndn_data_t));
      memcpy(&storage.self_identity_key[i], self_prv_key, sizeof(ndn_ecc_prv_t));
      for (int j = 0; j < self_cert->name.components_size - 4; j++) {
        ndn_name_append_component(&storage.self_identity[i], &self_cert->name.components[j]);
      }
      ndn_name_print(&storage.self_identity[i]);
      return NDN_SUCCESS;
    }
  }
  return NDN_OVERSIZE;
}